

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O0

void __thiscall
CTestGen9Resource_Test2DStencilArrayedCpuBltResource_Test::TestBody
          (CTestGen9Resource_Test2DStencilArrayedCpuBltResource_Test *this)

{
  TEST_BPP TVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  TEST_BPP TVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  GMM_RESOURCE_INFO *ResourceInfo_00;
  char *pcVar10;
  byte bVar11;
  uint32_t local_5c8;
  uint32_t local_5c4;
  uint local_5c0;
  uint local_5b8;
  uint local_5b4;
  uint local_5ac;
  AssertHelper local_5a0;
  Message local_598;
  undefined1 local_590 [8];
  AssertionResult gtest_ar_14;
  uint32_t Mip4RenderAlignedOffset;
  Message local_570;
  uint local_564;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_13;
  Message local_548;
  int local_53c;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_12;
  uint32_t Mip4Y;
  uint32_t Mip4X;
  uint32_t Mip4Offset;
  AssertHelper local_4b0;
  Message local_4a8;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_11;
  uint32_t Mip3RenderAlignedOffset;
  Message local_480;
  uint local_474;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_10;
  Message local_458;
  int local_44c;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_9;
  uint32_t Mip3Y;
  uint32_t Mip3X;
  uint32_t Mip3Offset;
  AssertHelper local_3c0;
  Message local_3b8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_8;
  uint32_t Mip2RenderAlignedOffset;
  Message local_390;
  uint local_384;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_7;
  Message local_368;
  int local_35c;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_6;
  uint32_t Mip2Y;
  uint32_t Mip2X;
  uint32_t Mip2Offset;
  AssertHelper local_2d0;
  Message local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_5;
  uint32_t Mip1RenderAlignedOffset;
  Message local_2a0;
  uint local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_4;
  Message local_278;
  uint local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_3;
  uint32_t Mip1Y;
  uint32_t Mip1X;
  uint32_t Mip1Offset;
  AssertHelper local_1e8;
  Message local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_2;
  Message local_1c0;
  uint local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_1;
  Message local_198 [3];
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  ulong uStack_168;
  uint32_t SliceY;
  uint64_t SliceTileOffset;
  ulong uStack_158;
  uint32_t Mip0Size;
  GMM_REQ_OFFSET_INFO ReqInfo;
  uint64_t ArrayOffset;
  uint8_t i_1;
  uint32_t MaxHeight;
  uint32_t MipHeight;
  uint32_t MipWidth;
  uint32_t i;
  GMM_RESOURCE_INFO *ResourceInfo;
  TEST_BPP bpp;
  uint32_t Mip2Width;
  uint32_t Mip1Width;
  uint32_t Mip0Width;
  uint32_t Mip2Height;
  uint32_t Mip1Height;
  uint32_t Mip0Height;
  uint32_t ExpectedPitch;
  uint32_t AlignedHeight;
  uint32_t AlignedWidth;
  GMM_RESCREATE_PARAMS gmmParams;
  uint32_t TileSize [2];
  uint32_t VAlign;
  uint32_t HAlign;
  CTestGen9Resource_Test2DStencilArrayedCpuBltResource_Test *this_local;
  
  gmmParams.MultiTileArch._0_1_ = 0x40;
  gmmParams.MultiTileArch.GpuVaMappingSet = '\0';
  gmmParams.MultiTileArch.LocalMemEligibilitySet = '\0';
  gmmParams.MultiTileArch.LocalMemPreferredSet = '\0';
  gmmParams.MultiTileArch.Reserved = 0x40;
  memset(&AlignedHeight,0,0x80);
  AlignedHeight = 2;
  gmmParams.ExistingSysMemSize._4_1_ = 1;
  gmmParams.Flags.Gpu =
       (anon_struct_8_45_9b07292e_for_Gpu)
       ((ulong)gmmParams.Flags.Gpu & 0xfffffffbffffffff | 0x400000000);
  gmmParams._0_8_ = gmmParams._0_8_ & 0xffffffffdfffffff | 0x20000000;
  gmmParams.BaseHeight = 0;
  gmmParams.Depth = 6;
  ExpectedPitch = 0;
  Mip0Width = 0;
  Mip1Width = 0;
  bpp = TEST_BPP_8;
  AlignedWidth = CTestResource::SetResourceFormat((CTestResource *)this,TEST_BPP_8);
  gmmParams.CpTag = 4;
  gmmParams._44_4_ = 0;
  gmmParams.field_6.BaseWidth = 4;
  ResourceInfo_00 =
       (GMM_RESOURCE_INFO *)
       (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                 (CommonULT::pGmmULTClientContext,&AlignedHeight);
  CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,ResourceInfo_00,8);
  CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,ResourceInfo_00,8);
  uVar3 = (gmmParams.CpTag + 7) - (gmmParams.CpTag + 7 & 7);
  uVar4 = (gmmParams.field_6.BaseWidth + 7) - (gmmParams.field_6.BaseWidth + 7 & 7);
  for (MipHeight = 1; MipHeight <= gmmParams.BaseHeight; MipHeight = MipHeight + 1) {
    bVar11 = (byte)MipHeight;
    if (uVar3 >> (bVar11 & 0x1f) < 2) {
      local_5ac = 1;
    }
    else {
      local_5ac = uVar3 >> (bVar11 & 0x1f);
    }
    if (uVar3 >> (bVar11 & 0x1f) < 2) {
      local_5b4 = 1;
    }
    else {
      local_5b4 = uVar3 >> (bVar11 & 0x1f);
    }
    TVar5 = (local_5ac + 7) - (local_5b4 + 7 & 7);
    if (uVar4 >> (bVar11 & 0x1f) < 2) {
      local_5b8 = 1;
    }
    else {
      local_5b8 = uVar4 >> (bVar11 & 0x1f);
    }
    if (uVar4 >> (bVar11 & 0x1f) < 2) {
      local_5c0 = 1;
    }
    else {
      local_5c0 = uVar4 >> (bVar11 & 0x1f);
    }
    uVar6 = (local_5b8 + 7) - (local_5c0 + 7 & 7);
    TVar1 = TVar5;
    if (MipHeight != 1) {
      TVar1 = bpp;
      if (MipHeight == 2) {
        Mip1Width = uVar6;
        uVar6 = Mip0Width;
        TVar5 = TVar5 + ExpectedPitch;
      }
      else {
        Mip1Width = uVar6 + Mip1Width;
        uVar6 = Mip0Width;
        TVar5 = ExpectedPitch;
      }
    }
    ExpectedPitch = TVar5;
    Mip0Width = uVar6;
    bpp = TVar1;
  }
  if (Mip1Width < Mip0Width) {
    local_5c4 = Mip0Width;
  }
  else {
    local_5c4 = Mip1Width;
  }
  uVar7 = uVar4 + local_5c4;
  if (uVar3 < ExpectedPitch) {
    local_5c8 = ExpectedPitch;
  }
  else {
    local_5c8 = CTestResource::GetBppValue((CTestResource *)this,TEST_BPP_8);
    local_5c8 = uVar3 * local_5c8;
  }
  uVar3 = (local_5c8 + gmmParams.MultiTileArch._0_4_ + -1) -
          (local_5c8 + gmmParams.MultiTileArch._0_4_ + -1 & gmmParams.MultiTileArch._0_4_ - 1);
  CTestResource::VerifyResourcePitch<true>((CTestResource *)this,ResourceInfo_00,uVar3 * 2);
  CTestResource::VerifyResourcePitchInTiles<true>
            ((CTestResource *)this,ResourceInfo_00,uVar3 / (uint)gmmParams.MultiTileArch._0_4_);
  CTestResource::VerifyResourceSize<true>
            ((CTestResource *)this,ResourceInfo_00,
             (ulong)((uVar3 * uVar7 * gmmParams.Depth + 0xfff) -
                    (uVar3 * uVar7 * gmmParams.Depth + 0xfff & 0xfff)));
  CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,ResourceInfo_00,(ulong)uVar7);
  for (ArrayOffset._7_1_ = 0; ArrayOffset._7_1_ < gmmParams.Depth && 3 < gmmParams.BaseHeight;
      ArrayOffset._7_1_ = ArrayOffset._7_1_ + 1) {
    iVar8 = uVar7 * uVar3 * (uint)ArrayOffset._7_1_;
    ReqInfo.StdLayout.Offset = 0;
    ReqInfo.StdLayout.TileRowPitch = 0;
    ReqInfo.Render.XOffset = 0;
    ReqInfo.Render.YOffset = 0;
    ReqInfo.Render.ZOffset = 0;
    ReqInfo.Render._20_4_ = 0;
    ReqInfo.Lock.Pitch = 0;
    ReqInfo.Lock.field_2 = (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
    ReqInfo.Render.field_0.Offset64 = 0;
    ReqInfo.Frame = GMM_DISPLAY_BASE;
    ReqInfo._28_4_ = 0;
    ReqInfo.Lock.field_0.Offset64 = 0;
    ReqInfo.MipLevel = 0;
    ReqInfo.Slice = 0;
    ReqInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    ReqInfo.Plane = GMM_NO_PLANE;
    ReqInfo._0_4_ = 0;
    ReqInfo.ArrayIndex = 0;
    uStack_158 = (ulong)CONCAT14(ArrayOffset._7_1_,1);
    (**(code **)(*(long *)ResourceInfo_00 + 0x68))(ResourceInfo_00,&stack0xfffffffffffffea8);
    SliceTileOffset._4_4_ = uVar3 * uVar4;
    uStack_168 = (ulong)((uVar7 * ArrayOffset._7_1_ & -gmmParams.MultiTileArch.Reserved) *
                        gmmParams.MultiTileArch._0_4_);
    gtest_ar.message_.ptr_._4_4_ = (uVar7 * ArrayOffset._7_1_) % gmmParams.MultiTileArch.Reserved;
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_180,"SliceTileOffset","ReqInfo.Render.Offset64",
               &stack0xfffffffffffffe98,(unsigned_long *)&ReqInfo.Lock.Pitch);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar2) {
      testing::Message::Message(local_198);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x664,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_198);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_198);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    local_1b4 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_1b0,"0",(int *)"ReqInfo.Render.XOffset",&local_1b4,&ReqInfo.Render);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
    if (!bVar2) {
      testing::Message::Message(&local_1c0);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x665,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_1c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_1d8,"SliceY","ReqInfo.Render.YOffset",
               (uint *)((long)&gtest_ar.message_.ptr_ + 4),
               (uint *)((long)&ReqInfo.Render.field_0 + 4));
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
    if (!bVar2) {
      testing::Message::Message(&local_1e0);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x666,pcVar10);
      testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      testing::Message::~Message(&local_1e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
    ReqInfo.StdLayout.Offset = 0;
    ReqInfo.StdLayout.TileRowPitch = 0;
    ReqInfo.Render.XOffset = 0;
    ReqInfo.Render.YOffset = 0;
    ReqInfo.Render.ZOffset = 0;
    ReqInfo.Render._20_4_ = 0;
    ReqInfo.Lock.Pitch = 0;
    ReqInfo.Lock.field_2 = (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
    ReqInfo.Render.field_0.Offset64 = 0;
    ReqInfo.Frame = GMM_DISPLAY_BASE;
    ReqInfo._28_4_ = 0;
    ReqInfo.Lock.field_0.Offset64 = 0;
    ReqInfo.MipLevel = 0;
    ReqInfo.Slice = 0;
    ReqInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    ReqInfo.Plane = GMM_NO_PLANE;
    ReqInfo._0_4_ = 1;
    ReqInfo.ArrayIndex = 0;
    uStack_158 = (ulong)CONCAT14(ArrayOffset._7_1_,1);
    (**(code **)(*(long *)ResourceInfo_00 + 0x68))(ResourceInfo_00,&stack0xfffffffffffffea8);
    uVar9 = SliceTileOffset._4_4_ + iVar8;
    gtest_ar_3.message_.ptr_._4_4_ = uVar9 / uVar3;
    local_26c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_268,"0",(int *)"ReqInfo.Render.XOffset",&local_26c,&ReqInfo.Render);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
    if (!bVar2) {
      testing::Message::Message(&local_278);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x671,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_278);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_278);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
    local_294 = gtest_ar_3.message_.ptr_._4_4_ % gmmParams.MultiTileArch.Reserved;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_290,"Mip1Y % TileSize[1]","ReqInfo.Render.YOffset",
               &local_294,(uint *)((long)&ReqInfo.Render.field_0 + 4));
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
    if (!bVar2) {
      testing::Message::Message(&local_2a0);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x672,pcVar10);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd58,&local_2a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd58);
      testing::Message::~Message(&local_2a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
    gtest_ar_3.message_.ptr_._4_4_ =
         gtest_ar_3.message_.ptr_._4_4_ & -gmmParams.MultiTileArch.Reserved;
    gtest_ar_5.message_.ptr_._4_4_ =
         gtest_ar_3.message_.ptr_._4_4_ * uVar3 +
         ((uVar9 % uVar3 & -gmmParams.MultiTileArch._0_4_) / (uint)gmmParams.MultiTileArch._0_4_) *
         gmmParams.MultiTileArch._0_4_ * gmmParams.MultiTileArch.Reserved;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_2c0,"Mip1RenderAlignedOffset","ReqInfo.Render.Offset64",
               (uint *)((long)&gtest_ar_5.message_.ptr_ + 4),(unsigned_long *)&ReqInfo.Lock.Pitch);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
    if (!bVar2) {
      testing::Message::Message(&local_2c8);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x676,pcVar10);
      testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      testing::Message::~Message(&local_2c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
    ReqInfo.StdLayout.Offset = 0;
    ReqInfo.StdLayout.TileRowPitch = 0;
    ReqInfo.Render.XOffset = 0;
    ReqInfo.Render.YOffset = 0;
    ReqInfo.Render.ZOffset = 0;
    ReqInfo.Render._20_4_ = 0;
    ReqInfo.Lock.Pitch = 0;
    ReqInfo.Lock.field_2 = (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
    ReqInfo.Render.field_0.Offset64 = 0;
    ReqInfo.Frame = GMM_DISPLAY_BASE;
    ReqInfo._28_4_ = 0;
    ReqInfo.Lock.field_0.Offset64 = 0;
    ReqInfo.MipLevel = 0;
    ReqInfo.Slice = 0;
    ReqInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    ReqInfo.Plane = GMM_NO_PLANE;
    ReqInfo._0_4_ = 2;
    ReqInfo.ArrayIndex = 0;
    uStack_158 = (ulong)CONCAT14(ArrayOffset._7_1_,1);
    (**(code **)(*(long *)ResourceInfo_00 + 0x68))(ResourceInfo_00,&stack0xfffffffffffffea8);
    uVar6 = CTestResource::GetBppValue((CTestResource *)this,TEST_BPP_8);
    uVar9 = bpp * uVar6 + uVar4 * uVar3 + iVar8;
    gtest_ar_6.message_.ptr_._4_4_ = uVar9 / uVar3;
    local_35c = 8;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((EqHelper<false> *)local_358,"8","ReqInfo.Render.XOffset",&local_35c,
               (uint *)&ReqInfo.Render);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
    if (!bVar2) {
      testing::Message::Message(&local_368);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x682,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_368);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_368);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
    local_384 = gtest_ar_6.message_.ptr_._4_4_ % gmmParams.MultiTileArch.Reserved;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_380,"Mip2Y % TileSize[1]","ReqInfo.Render.YOffset",
               &local_384,(uint *)((long)&ReqInfo.Render.field_0 + 4));
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
    if (!bVar2) {
      testing::Message::Message(&local_390);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffc68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x683,pcVar10);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffc68,&local_390);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc68);
      testing::Message::~Message(&local_390);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
    gtest_ar_6.message_.ptr_._4_4_ =
         gtest_ar_6.message_.ptr_._4_4_ & -gmmParams.MultiTileArch.Reserved;
    gtest_ar_8.message_.ptr_._4_4_ =
         gtest_ar_6.message_.ptr_._4_4_ * uVar3 +
         ((uVar9 % uVar3 & -gmmParams.MultiTileArch._0_4_) / (uint)gmmParams.MultiTileArch._0_4_) *
         gmmParams.MultiTileArch._0_4_ * gmmParams.MultiTileArch.Reserved;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_3b0,"Mip2RenderAlignedOffset","ReqInfo.Render.Offset64",
               (uint *)((long)&gtest_ar_8.message_.ptr_ + 4),(unsigned_long *)&ReqInfo.Lock.Pitch);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
    if (!bVar2) {
      testing::Message::Message(&local_3b8);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
      testing::internal::AssertHelper::AssertHelper
                (&local_3c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x687,pcVar10);
      testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
      testing::internal::AssertHelper::~AssertHelper(&local_3c0);
      testing::Message::~Message(&local_3b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
    ReqInfo.StdLayout.Offset = 0;
    ReqInfo.StdLayout.TileRowPitch = 0;
    ReqInfo.Render.XOffset = 0;
    ReqInfo.Render.YOffset = 0;
    ReqInfo.Render.ZOffset = 0;
    ReqInfo.Render._20_4_ = 0;
    ReqInfo.Lock.Pitch = 0;
    ReqInfo.Lock.field_2 = (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
    ReqInfo.Render.field_0.Offset64 = 0;
    ReqInfo.Frame = GMM_DISPLAY_BASE;
    ReqInfo._28_4_ = 0;
    ReqInfo.Lock.field_0.Offset64 = 0;
    ReqInfo.MipLevel = 0;
    ReqInfo.Slice = 0;
    ReqInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    ReqInfo.Plane = GMM_NO_PLANE;
    ReqInfo._0_4_ = 3;
    ReqInfo.ArrayIndex = 0;
    uStack_158 = (ulong)CONCAT14(ArrayOffset._7_1_,1);
    (**(code **)(*(long *)ResourceInfo_00 + 0x68))(ResourceInfo_00,&stack0xfffffffffffffea8);
    uVar6 = CTestResource::GetBppValue((CTestResource *)this,TEST_BPP_8);
    uVar9 = bpp * uVar6 + (uVar4 + ((uVar4 >> 2) + 7 & 0xfffffff8)) * uVar3 + iVar8;
    gtest_ar_9.message_.ptr_._4_4_ = uVar9 / uVar3;
    local_44c = 8;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((EqHelper<false> *)local_448,"8","ReqInfo.Render.XOffset",&local_44c,
               (uint *)&ReqInfo.Render);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
    if (!bVar2) {
      testing::Message::Message(&local_458);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x693,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_458);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_458);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
    local_474 = gtest_ar_9.message_.ptr_._4_4_ % gmmParams.MultiTileArch.Reserved;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_470,"Mip3Y % TileSize[1]","ReqInfo.Render.YOffset",
               &local_474,(uint *)((long)&ReqInfo.Render.field_0 + 4));
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
    if (!bVar2) {
      testing::Message::Message(&local_480);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffb78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x694,pcVar10);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffb78,&local_480);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb78);
      testing::Message::~Message(&local_480);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
    gtest_ar_9.message_.ptr_._4_4_ =
         gtest_ar_9.message_.ptr_._4_4_ & -gmmParams.MultiTileArch.Reserved;
    gtest_ar_11.message_.ptr_._4_4_ =
         gtest_ar_9.message_.ptr_._4_4_ * uVar3 +
         ((uVar9 % uVar3 & -gmmParams.MultiTileArch._0_4_) / (uint)gmmParams.MultiTileArch._0_4_) *
         gmmParams.MultiTileArch._0_4_ * gmmParams.MultiTileArch.Reserved;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_4a0,"Mip3RenderAlignedOffset","ReqInfo.Render.Offset64",
               (uint *)((long)&gtest_ar_11.message_.ptr_ + 4),(unsigned_long *)&ReqInfo.Lock.Pitch);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
    if (!bVar2) {
      testing::Message::Message(&local_4a8);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
      testing::internal::AssertHelper::AssertHelper
                (&local_4b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x698,pcVar10);
      testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
      testing::internal::AssertHelper::~AssertHelper(&local_4b0);
      testing::Message::~Message(&local_4a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
    ReqInfo.StdLayout.Offset = 0;
    ReqInfo.StdLayout.TileRowPitch = 0;
    ReqInfo.Render.XOffset = 0;
    ReqInfo.Render.YOffset = 0;
    ReqInfo.Render.ZOffset = 0;
    ReqInfo.Render._20_4_ = 0;
    ReqInfo.Lock.Pitch = 0;
    ReqInfo.Lock.field_2 = (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
    ReqInfo.Render.field_0.Offset64 = 0;
    ReqInfo.Frame = GMM_DISPLAY_BASE;
    ReqInfo._28_4_ = 0;
    ReqInfo.Lock.field_0.Offset64 = 0;
    ReqInfo.MipLevel = 0;
    ReqInfo.Slice = 0;
    ReqInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    ReqInfo.Plane = GMM_NO_PLANE;
    ReqInfo._0_4_ = 4;
    ReqInfo.ArrayIndex = 0;
    uStack_158 = (ulong)CONCAT14(ArrayOffset._7_1_,1);
    (**(code **)(*(long *)ResourceInfo_00 + 0x68))(ResourceInfo_00,&stack0xfffffffffffffea8);
    uVar6 = CTestResource::GetBppValue((CTestResource *)this,TEST_BPP_8);
    uVar9 = bpp * uVar6 +
            (uVar4 + ((uVar4 >> 2) + 7 & 0xfffffff8) + ((uVar4 >> 3) + 7 & 0xfffffff8)) * uVar3 +
            iVar8;
    gtest_ar_12.message_.ptr_._4_4_ = uVar9 / uVar3;
    local_53c = 8;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((EqHelper<false> *)local_538,"8","ReqInfo.Render.XOffset",&local_53c,
               (uint *)&ReqInfo.Render);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
    if (!bVar2) {
      testing::Message::Message(&local_548);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_538);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x6a4,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_548);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
      testing::Message::~Message(&local_548);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
    local_564 = gtest_ar_12.message_.ptr_._4_4_ % gmmParams.MultiTileArch.Reserved;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_560,"Mip4Y % TileSize[1]","ReqInfo.Render.YOffset",
               &local_564,(uint *)((long)&ReqInfo.Render.field_0 + 4));
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
    if (!bVar2) {
      testing::Message::Message(&local_570);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffa88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x6a5,pcVar10);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffa88,&local_570);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffa88);
      testing::Message::~Message(&local_570);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
    gtest_ar_12.message_.ptr_._4_4_ =
         gtest_ar_12.message_.ptr_._4_4_ & -gmmParams.MultiTileArch.Reserved;
    gtest_ar_14.message_.ptr_._4_4_ =
         gtest_ar_12.message_.ptr_._4_4_ * uVar3 +
         ((uVar9 % uVar3 & -gmmParams.MultiTileArch._0_4_) / (uint)gmmParams.MultiTileArch._0_4_) *
         gmmParams.MultiTileArch._0_4_ * gmmParams.MultiTileArch.Reserved;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_590,"Mip4RenderAlignedOffset","ReqInfo.Render.Offset64",
               (uint *)((long)&gtest_ar_14.message_.ptr_ + 4),(unsigned_long *)&ReqInfo.Lock.Pitch);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
    if (!bVar2) {
      testing::Message::Message(&local_598);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_590);
      testing::internal::AssertHelper::AssertHelper
                (&local_5a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x6a9,pcVar10);
      testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
      testing::internal::AssertHelper::~AssertHelper(&local_5a0);
      testing::Message::~Message(&local_598);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  }
  (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
            (CommonULT::pGmmULTClientContext,ResourceInfo_00);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test2DStencilArrayedCpuBltResource)
{
    const uint32_t HAlign = {8};
    const uint32_t VAlign = {8};

    const uint32_t TileSize[2] = {64, 64}; //TileW

    GMM_RESCREATE_PARAMS gmmParams      = {};
    gmmParams.Type                      = RESOURCE_2D;
    gmmParams.NoGfxMemory               = 1;
    gmmParams.Flags.Info.TiledW         = 1;
    gmmParams.Flags.Gpu.SeparateStencil = 1;
    gmmParams.MaxLod                    = 0;
    gmmParams.ArraySize                 = 6;

    {
        uint32_t AlignedWidth  = 0;
        uint32_t AlignedHeight = 0;
        uint32_t ExpectedPitch = 0;
        // Valigned Mip Heights
        uint32_t Mip0Height = 0;
        uint32_t Mip1Height = 0;
        uint32_t Mip2Height = 0;

        // Haligned Mip Widths
        uint32_t Mip0Width = 0;
        uint32_t Mip1Width = 0;
        uint32_t Mip2Width = 0;

        TEST_BPP bpp          = TEST_BPP_8;
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x4;
        gmmParams.BaseHeight  = 0x4;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);

        // Mip resource Aligned Width calculation
        Mip0Width  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        Mip0Height = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);

        for(uint32_t i = 1; i <= gmmParams.MaxLod; i++)
        {
            uint32_t MipWidth  = GMM_ULT_ALIGN(GMM_ULT_MAX(Mip0Width >> i, 1), HAlign);
            uint32_t MipHeight = GMM_ULT_ALIGN(GMM_ULT_MAX(Mip0Height >> i, 1), VAlign);
            if(i == 1)
            {
                Mip1Width = AlignedWidth = MipWidth;
                Mip1Height               = MipHeight;
            }
            else if(i == 2)
            {
                AlignedWidth += MipWidth;
                Mip2Height = MipHeight;
            }
            else
            {
                Mip2Height += MipHeight;
            }
        }

        uint32_t MaxHeight = GMM_ULT_MAX(Mip1Height, Mip2Height);
        AlignedHeight      = Mip0Height + MaxHeight;

        ExpectedPitch = GMM_ULT_MAX(AlignedWidth, Mip0Width) * GetBppValue(bpp);
        ExpectedPitch = GMM_ULT_ALIGN(ExpectedPitch, TileSize[0]);
        //TileW is programmed as row-interleaved.. ie doubled pitch
        VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch * 2);

        VerifyResourcePitchInTiles<true>(ResourceInfo, static_cast<uint32_t>(ExpectedPitch / TileSize[0]));
        VerifyResourceSize<true>(ResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * AlignedHeight * gmmParams.ArraySize, PAGE_SIZE));
        VerifyResourceQPitch<true>(ResourceInfo, AlignedHeight);

        for(uint8_t i = 0; i < gmmParams.ArraySize && gmmParams.MaxLod >= 4; i++)
        {
            uint64_t ArrayOffset = AlignedHeight * ExpectedPitch * i;

            // Mip 0 offsets, offset is 0,0
            GMM_REQ_OFFSET_INFO ReqInfo = {0};
            ReqInfo.MipLevel            = 0;
            ReqInfo.ReqRender           = 1;
            ReqInfo.ArrayIndex          = i;
            ResourceInfo->GetOffset(ReqInfo);

            uint32_t Mip0Size        = ExpectedPitch * Mip0Height;
            uint64_t SliceTileOffset = GFX_ALIGN_FLOOR(AlignedHeight * i, TileSize[1]) * TileSize[0];
            uint32_t SliceY          = (AlignedHeight * i) % TileSize[1];
            EXPECT_EQ(SliceTileOffset, ReqInfo.Render.Offset64);
            EXPECT_EQ(0, ReqInfo.Render.XOffset);
            EXPECT_EQ(SliceY, ReqInfo.Render.YOffset);

            // Mip 1 offsets
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 1;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);
            uint32_t Mip1Offset = Mip0Size + ArrayOffset;
            uint32_t Mip1X      = uint32_t(Mip1Offset % ExpectedPitch);
            uint32_t Mip1Y      = uint32_t(Mip1Offset / ExpectedPitch);
            EXPECT_EQ(0, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip1Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip1X                            = GFX_ALIGN_FLOOR(Mip1X, TileSize[0]);
            Mip1Y                            = GFX_ALIGN_FLOOR(Mip1Y, TileSize[1]);
            uint32_t Mip1RenderAlignedOffset = Mip1Y * ExpectedPitch + (Mip1X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip1RenderAlignedOffset, ReqInfo.Render.Offset64);


            // Mip 2 offset
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 2;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);
            uint32_t Mip2Offset = Mip1Width * GetBppValue(bpp) + Mip0Height * ExpectedPitch + ArrayOffset;
            uint32_t Mip2X      = uint32_t(Mip2Offset % ExpectedPitch);
            uint32_t Mip2Y      = uint32_t(Mip2Offset / ExpectedPitch);
            EXPECT_EQ(8, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip2Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip2X                            = GFX_ALIGN_FLOOR(Mip2X, TileSize[0]);
            Mip2Y                            = GFX_ALIGN_FLOOR(Mip2Y, TileSize[1]);
            uint32_t Mip2RenderAlignedOffset = Mip2Y * ExpectedPitch + (Mip2X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip2RenderAlignedOffset, ReqInfo.Render.Offset64);

            // Mip 3 offset
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 3;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);

            uint32_t Mip3Offset = Mip1Width * GetBppValue(bpp) + (Mip0Height + GMM_ULT_ALIGN(Mip0Height >> 2, VAlign)) * ExpectedPitch + ArrayOffset;
            uint32_t Mip3X      = uint32_t(Mip3Offset % ExpectedPitch);
            uint32_t Mip3Y      = uint32_t(Mip3Offset / ExpectedPitch);
            EXPECT_EQ(8, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip3Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip3X                            = GFX_ALIGN_FLOOR(Mip3X, TileSize[0]);
            Mip3Y                            = GFX_ALIGN_FLOOR(Mip3Y, TileSize[1]);
            uint32_t Mip3RenderAlignedOffset = Mip3Y * ExpectedPitch + (Mip3X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip3RenderAlignedOffset, ReqInfo.Render.Offset64);

            // Mip 4 offset
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 4;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);
            uint32_t Mip4Offset = 0;
            Mip4Offset          = Mip1Width * GetBppValue(bpp) + (Mip0Height + GMM_ULT_ALIGN(Mip0Height >> 2, VAlign) + GMM_ULT_ALIGN(Mip0Height >> 3, VAlign)) * ExpectedPitch + ArrayOffset;
            uint32_t Mip4X      = uint32_t(Mip4Offset % ExpectedPitch);
            uint32_t Mip4Y      = uint32_t(Mip4Offset / ExpectedPitch);
            EXPECT_EQ(8, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip4Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip4X                            = GFX_ALIGN_FLOOR(Mip4X, TileSize[0]);
            Mip4Y                            = GFX_ALIGN_FLOOR(Mip4Y, TileSize[1]);
            uint32_t Mip4RenderAlignedOffset = Mip4Y * ExpectedPitch + (Mip4X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip4RenderAlignedOffset, ReqInfo.Render.Offset64);
        }

        //Verify CpuBlt path (uses Render offset for upload)
        {
#ifdef _WIN32
#define ULT_ALIGNED_MALLOC(Size, alignBytes) _aligned_malloc(Size, alignBytes)
#define ULT_ALIGNED_FREE(ptr) _aligned_free(ptr)
#else
#define ULT_ALIGNED_MALLOC(Size, alignBytes) memalign(alignBytes, Size)
#define ULT_ALIGNED_FREE(ptr) free(ptr)
#endif

#ifdef _WIN32
            void *LockVA = ULT_ALIGNED_MALLOC(ResourceInfo->GetSizeSurface(), ResourceInfo->GetBaseAlignment());
            memset(LockVA, 0, ResourceInfo->GetSizeSurface());
            void *Sysmem = malloc(gmmParams.BaseWidth64 * gmmParams.BaseHeight);
            memset(Sysmem, 0xbb, gmmParams.BaseWidth64 * gmmParams.BaseHeight);
            //Test Upload
            GMM_RES_COPY_BLT Blt  = {0};
            Blt.Gpu.pData         = LockVA;
            Blt.Gpu.Slice         = 4;
            Blt.Gpu.MipLevel      = 0;
            Blt.Sys.BufferSize    = gmmParams.BaseWidth64 * gmmParams.BaseHeight;
            Blt.Sys.pData         = Sysmem;
            Blt.Sys.RowPitch      = gmmParams.BaseWidth64;
            Blt.Sys.PixelPitch    = 1;
            Blt.Sys.SlicePitch    = Blt.Sys.BufferSize;
            Blt.Blt.Upload        = 1;
            Blt.Blt.BytesPerPixel = 1;
            ResourceInfo->CpuBlt(&Blt);

            uint64_t Offset = 0x100; /*Blt.Gpu.Slice * ResourceInfo->GetQPitchInBytes();*/ // Need SwizzledOffset
            for(uint8_t byte = 0; byte < Blt.Sys.BufferSize; byte++)
            {
                uint8_t *Byte = ((uint8_t *)LockVA) + Offset + byte;
                EXPECT_EQ(Byte[0], 0xbb);
            }

            free(Sysmem);
            ULT_ALIGNED_FREE(LockVA);
#endif
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}